

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_to_mac(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_ptr arg1;
  uint val_00;
  TCGv_i32 pTVar1;
  int accnum;
  TCGv_i32 val;
  TCGv_i64 acc;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val_00 = (int)(uint)insn >> 9 & 3;
  ret = tcg_ctx_00->cpu_macc[(int)val_00];
  pTVar1 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (pTVar1 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    if ((s->env->macsr & 0x20) == 0) {
      if ((s->env->macsr & 0x40) == 0) {
        tcg_gen_extu_i32_i64_m68k(tcg_ctx_00,ret,pTVar1);
      }
      else {
        tcg_gen_ext_i32_i64_m68k(tcg_ctx_00,ret,pTVar1);
      }
    }
    else {
      tcg_gen_ext_i32_i64_m68k(tcg_ctx_00,ret,pTVar1);
      tcg_gen_shli_i64_m68k(tcg_ctx_00,ret,ret,8);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx_00,QREG_MACSR,QREG_MACSR,0x100 << (sbyte)val_00 ^ 0xffffffff);
    gen_mac_clear_flags(tcg_ctx_00);
    arg1 = tcg_ctx_00->cpu_env;
    pTVar1 = tcg_const_i32_m68k(tcg_ctx_00,val_00);
    gen_helper_mac_set_flags(tcg_ctx_00,arg1,pTVar1);
  }
  return;
}

Assistant:

DISAS_INSN(to_mac)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 acc;
    TCGv val;
    int accnum;
    accnum = (insn >> 9) & 3;
    acc = MACREG(accnum);
    SRC_EA(env, val, OS_LONG, 0, NULL);
    if (s->env->macsr & MACSR_FI) {
        tcg_gen_ext_i32_i64(tcg_ctx, acc, val);
        tcg_gen_shli_i64(tcg_ctx, acc, acc, 8);
    } else if (s->env->macsr & MACSR_SU) {
        tcg_gen_ext_i32_i64(tcg_ctx, acc, val);
    } else {
        tcg_gen_extu_i32_i64(tcg_ctx, acc, val);
    }
    tcg_gen_andi_i32(tcg_ctx, QREG_MACSR, QREG_MACSR, ~(MACSR_PAV0 << accnum));
    gen_mac_clear_flags(tcg_ctx);
    gen_helper_mac_set_flags(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, accnum));
}